

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::
         do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  byte bVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar3;
  appender aVar4;
  byte *pbVar5;
  long lVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  int num_zeros;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_ca [14];
  undefined1 auStack_bc [8];
  sign_t local_b4;
  float_specs local_b0;
  undefined1 local_a4 [8];
  int iStack_9c;
  long local_98;
  undefined1 local_90 [16];
  char local_80;
  anon_class_72_9_d68ba176 local_78;
  
  local_b0 = (float_specs)fp->significand;
  lVar6 = 0x3f;
  if (((ulong)local_b0 | 1) != 0) {
    for (; ((ulong)local_b0 | 1) >> lVar6 == 0; lVar6 = lVar6 + -1) {
    }
  }
  local_ca._6_4_ =
       (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar6] -
       (uint)((ulong)local_b0 <
             (ulong)*(float_specs *)
                     (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                     (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar6] * 8));
  local_ca[1] = 0x30;
  auStack_bc._0_4_ = fspecs._4_4_;
  local_b4 = (uint)auStack_bc._0_4_ >> 8 & 0xff;
  fVar1 = fspecs;
  if ((int)local_ca._6_4_ < 0) goto LAB_0011acd7;
  uVar13 = (local_ca._6_4_ + 1) - (uint)(local_b4 == none);
  uVar11 = (ulong)uVar13;
  local_ca[0] = '.';
  uVar9 = (uint)auStack_bc._0_4_ >> 0x11;
  unique0x10000517 = fspecs;
  if ((uVar9 & 1) != 0) {
    local_ca[0] = decimal_point_impl<char>(loc);
  }
  iVar8 = fp->exponent;
  local_a4._0_4_ = local_ca._6_4_ + iVar8;
  if (local_ca[0xe] == '\x01') {
LAB_0011aa44:
    iVar8 = local_ca._6_4_ + iVar8 + -1;
    if (((uint)auStack_bc._0_4_ >> 0x14 & 1) == 0) {
      iVar10 = 0;
      if (local_ca._6_4_ == 1) {
        local_ca[0] = '\0';
        iVar10 = 0;
      }
    }
    else {
      iVar10 = 0;
      if (0 < (int)(local_ca._10_4_ - local_ca._6_4_)) {
        iVar10 = local_ca._10_4_ - local_ca._6_4_;
      }
      uVar11 = (ulong)(uVar13 + iVar10);
    }
    local_78.sign = (sign_t *)CONCAT44(local_78.sign._4_4_,local_b4);
    local_78.significand = (significand_type *)local_b0;
    local_78.significand_size._0_5_ = CONCAT14(local_ca[0],local_ca._6_4_);
    local_78.fp._0_5_ = CONCAT14(0x30,iVar10);
    local_78.fp = (decimal_fp<double> *)
                  (CONCAT26(local_78.fp._6_2_,
                            CONCAT15((((uint)auStack_bc._0_4_ >> 0x10 & 1) == 0) << 5,
                                     local_78.fp._0_5_)) | 0x450000000000);
    local_78.grouping = (digit_grouping<char> *)CONCAT44(local_78.grouping._4_4_,iVar8);
    if (specs->width < 1) {
      bVar3.container =
           (buffer<char> *)
           do_write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<double>,_char,_fmt::v8::detail::digit_grouping<char>_>
           ::anon_class_40_8_dbbf3351::operator()
                     ((anon_class_40_8_dbbf3351 *)&local_78,
                      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    else {
      if ((int)local_a4._0_4_ < 1) {
        iVar8 = 1 - local_a4._0_4_;
      }
      lVar6 = 2;
      if (99 < iVar8) {
        lVar6 = (ulong)(999 < iVar8) + 3;
      }
      sVar12 = uVar11 + lVar6 + (3 - (ulong)(local_ca[0] == '\0'));
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                     (out,specs,sVar12,sVar12,(anon_class_40_8_dbbf3351 *)&local_78);
    }
  }
  else {
    if (((ulong)stack0xffffffffffffff40 & 0xff00000000) == 0) {
      iVar10 = 0x10;
      if (0 < (int)local_ca._10_4_) {
        iVar10 = local_ca._10_4_;
      }
      if (((int)local_a4._0_4_ < -3) || (iVar10 < (int)local_a4._0_4_)) goto LAB_0011aa44;
    }
    if (iVar8 < 0) {
      if ((int)local_a4._0_4_ < 1) {
        iVar8 = -local_a4._0_4_;
        local_a4._4_4_ = iVar8;
        if (SBORROW4(local_ca._10_4_,iVar8) != (int)(local_ca._10_4_ + local_a4._0_4_) < 0) {
          local_a4._4_4_ = local_ca._10_4_;
        }
        if ((int)local_ca._10_4_ < 0) {
          local_a4._4_4_ = iVar8;
        }
        if (local_ca._6_4_ != 0) {
          local_a4._4_4_ = iVar8;
        }
        bVar2 = 1;
        if (local_ca._6_4_ == 0 && local_a4._4_4_ == 0) {
          bVar2 = (auStack_bc[2] & 0x10) >> 4;
        }
        local_ca[2] = bVar2;
        fVar1 = stack0xffffffffffffff40;
        if (-1 < (int)local_a4._4_4_) {
          sVar12 = ((uint)bVar2 + local_a4._4_4_ + 1) + uVar11;
          local_78.sign = &local_b4;
          local_78.significand = (significand_type *)(local_ca + 1);
          local_78.significand_size = (int *)(local_ca + 2);
          local_78.fp = (decimal_fp<double> *)local_ca;
          local_78.grouping = (digit_grouping<char> *)(local_a4 + 4);
          local_78.fspecs = &local_b0;
          local_78.decimal_point = local_ca + 6;
          aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_&>
                            (out,specs,sVar12,sVar12,(anon_class_56_7_162c6e41 *)&local_78);
          return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
                 aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
        }
LAB_0011acd7:
        stack0xffffffffffffff40 = fVar1;
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/core.h"
                    ,0x1aa,"negative value");
      }
      uVar9 = local_ca._10_4_ - local_ca._6_4_ & (int)(auStack_bc._0_4_ << 0xb) >> 0x1f;
      local_ca._2_4_ = uVar9;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)(local_a4 + 4),loc,
                 (bool)((byte)((uint)auStack_bc._0_4_ >> 0x11) & 1));
      pbVar5 = (byte *)CONCAT44(iStack_9c,local_a4._4_4_);
      pbVar7 = pbVar5 + local_98;
      iVar8 = 0;
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      sVar12 = uVar9 + uVar11;
      do {
        iVar10 = 0x7fffffff;
        if (local_80 != '\0') {
          if (pbVar5 == pbVar7) {
            uVar9 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar2 = *pbVar5;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_0011abb2;
            pbVar5 = pbVar5 + 1;
            uVar9 = (uint)bVar2;
          }
          iVar8 = iVar8 + uVar9;
          iVar10 = iVar8;
        }
LAB_0011abb2:
        sVar12 = sVar12 + 1;
      } while (iVar10 < (int)local_ca._6_4_);
      local_78.sign = &local_b4;
      local_78.significand = (significand_type *)&local_b0;
      local_78.significand_size = (int *)(local_ca + 6);
      local_78.fp = (decimal_fp<double> *)local_a4;
      local_78.grouping = (digit_grouping<char> *)local_ca;
      local_78.decimal_point = local_ca + 2;
      local_78.num_zeros = (int *)(local_ca + 1);
      local_78.fspecs = (float_specs *)(local_a4 + 4);
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_&>
                     (out,specs,sVar12,sVar12,(anon_class_64_8_e6ffa566 *)&local_78);
    }
    else {
      uVar11 = (ulong)(iVar8 + uVar13);
      local_ca._2_4_ = local_ca._10_4_ - local_a4._0_4_;
      if (((uint)auStack_bc._0_4_ >> 0x14 & 1) != 0) {
        if (local_ca[0xe] != '\x02' && (int)local_ca._2_4_ < 1) {
          local_ca._2_4_ = 1;
        }
        if (0 < (int)local_ca._2_4_) {
          uVar11 = uVar11 + (uint)local_ca._2_4_ + 1;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)(local_a4 + 4),loc,
                 (bool)((byte)((uint)auStack_bc._0_4_ >> 0x11) & 1));
      pbVar5 = (byte *)CONCAT44(iStack_9c,local_a4._4_4_);
      pbVar7 = pbVar5 + local_98;
      sVar12 = uVar11 - 1;
      iVar8 = 0;
      do {
        iVar10 = 0x7fffffff;
        if (local_80 != '\0') {
          if (pbVar5 == pbVar7) {
            uVar9 = (uint)(char)pbVar7[-1];
          }
          else {
            bVar2 = *pbVar5;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_0011a9db;
            pbVar5 = pbVar5 + 1;
            uVar9 = (uint)bVar2;
          }
          iVar8 = iVar8 + uVar9;
          iVar10 = iVar8;
        }
LAB_0011a9db:
        sVar12 = sVar12 + 1;
      } while (iVar10 < (int)local_ca._6_4_);
      local_78.sign = &local_b4;
      local_78.significand = (significand_type *)&local_b0;
      local_78.significand_size = (int *)(local_ca + 6);
      local_78.fspecs = (float_specs *)(local_ca + 10);
      local_78.decimal_point = local_ca;
      local_78.num_zeros = (int *)(local_ca + 2);
      local_78.zero = local_ca + 1;
      local_78.fp = fp;
      local_78.grouping = (digit_grouping<char> *)(local_a4 + 4);
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_&>
                     (out,specs,sVar12,sVar12,&local_78);
    }
    if ((undefined1 *)CONCAT44(iStack_9c,local_a4._4_4_) != local_90) {
      operator_delete((undefined1 *)CONCAT44(iStack_9c,local_a4._4_4_));
    }
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}